

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::Node::Node(Node *this,Deserializer *input)

{
  uint uVar1;
  Text *pTVar2;
  unique_ptr<Text,_std::default_delete<Text>_> local_38;
  unique_ptr<Text,_std::default_delete<Text>_> local_30 [3];
  Deserializer *local_18;
  Deserializer *input_local;
  Node *this_local;
  
  this->left = (Node *)0x0;
  this->right = (Node *)0x0;
  local_18 = input;
  input_local = (Deserializer *)this;
  Point::Point(&this->old_extent,input);
  Point::Point(&this->new_extent,local_18);
  Point::Point(&this->old_distance_from_left_ancestor,local_18);
  Point::Point(&this->new_distance_from_left_ancestor,local_18);
  std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
            ((unique_ptr<Text,std::default_delete<Text>> *)&this->old_text);
  std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
            ((unique_ptr<Text,std::default_delete<Text>> *)&this->new_text);
  uVar1 = Deserializer::read<unsigned_int>(local_18);
  if (uVar1 == 0) {
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->old_text,(nullptr_t)0x0);
    uVar1 = Deserializer::read<unsigned_int>(local_18);
    this->old_text_size_ = uVar1;
  }
  else {
    pTVar2 = (Text *)operator_new(0x38);
    Text::Text(pTVar2,local_18);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)local_30,pTVar2);
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->old_text,local_30);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(local_30);
    this->old_text_size_ = 0;
  }
  uVar1 = Deserializer::read<unsigned_int>(local_18);
  if (uVar1 == 0) {
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->new_text,(nullptr_t)0x0);
  }
  else {
    pTVar2 = (Text *)operator_new(0x38);
    Text::Text(pTVar2,local_18);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_38,pTVar2);
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->new_text,&local_38);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_38);
  }
  return;
}

Assistant:

Node(Deserializer &input) :
    left{nullptr},
    right{nullptr},
    old_extent{input},
    new_extent{input},
    old_distance_from_left_ancestor{input},
    new_distance_from_left_ancestor{input} {

    if (input.read<uint32_t>()) {
      old_text = unique_ptr<Text>{new Text{input}};
      old_text_size_ = 0;
    } else {
      old_text = nullptr;
      old_text_size_ = input.read<uint32_t>();
    }

    if (input.read<uint32_t>()) {
      new_text = unique_ptr<Text>{new Text{input}};
    } else {
      new_text = nullptr;
    }
  }